

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_1::ValidateGroupNonUniformBallotBitExtract
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  char *pcVar4;
  DiagnosticStream DStack_1f8;
  
  bVar1 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
  if (bVar1) {
    uVar2 = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar1 = ValidationState_t::IsUnsignedIntVectorType(_,uVar2);
    if ((bVar1) && (uVar2 = ValidationState_t::GetDimension(_,uVar2), uVar2 == 4)) {
      uVar2 = ValidationState_t::GetOperandTypeId(_,inst,4);
      bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar2);
      if (bVar1) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar4 = "Id must be an unsigned integer scalar";
      lVar3 = 0x25;
    }
    else {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar4 = "Value must be a 4-component unsigned integer vector";
      lVar3 = 0x33;
    }
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar4 = "Result must be a boolean scalar";
    lVar3 = 0x1f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar4,lVar3);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateGroupNonUniformBallotBitExtract(ValidationState_t& _,
                                                     const Instruction* inst) {
  if (!_.IsBoolScalarType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result must be a boolean scalar";
  }

  const auto value_type_id = _.GetOperandTypeId(inst, 3);
  if (!_.IsUnsignedIntVectorType(value_type_id)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Value must be a 4-component unsigned integer vector";
  }

  if (_.GetDimension(value_type_id) != 4) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Value must be a 4-component unsigned integer vector";
  }

  const auto id_type_id = _.GetOperandTypeId(inst, 4);
  if (!_.IsUnsignedIntScalarType(id_type_id)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Id must be an unsigned integer scalar";
  }

  return SPV_SUCCESS;
}